

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int Gia_ManFromIfLogicCreateLutSpecial
              (Gia_Man_t *pNew,word *pRes,Vec_Int_t *vLeaves,Vec_Int_t *vLeavesTemp,
              Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2,Vec_Int_t *vPacking)

{
  uint uVar1;
  word wVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint Entry;
  long lVar7;
  word local_38;
  
  wVar2 = If_CutPerformDerive07
                    ((If_Man_t *)0x0,(uint *)pRes,vLeaves->nSize,vLeaves->nSize,(char *)0x0);
  vLeavesTemp->nSize = 0;
  lVar7 = 0x10;
  do {
    uVar1 = (uint)(wVar2 >> ((byte)lVar7 & 0x3f));
    uVar5 = uVar1 & 7;
    iVar6 = vLeaves->nSize;
    if (uVar5 == 6) {
      if (iVar6 != 5) {
        if (6 < iVar6) {
          piVar3 = vLeaves->pArray + 6;
          goto LAB_006bd92c;
        }
        goto LAB_006bda63;
      }
    }
    else {
      if (iVar6 <= (int)uVar5) goto LAB_006bda63;
      piVar3 = (int *)((ulong)((uVar1 & 7) << 2) + (long)vLeaves->pArray);
LAB_006bd92c:
      Vec_IntPush(vLeavesTemp,*piVar3);
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x20);
  local_38 = (wVar2 & 0xffff) * 0x1000100010001;
  uVar1 = Gia_ManFromIfLogicCreateLut(pNew,&local_38,vLeavesTemp,vCover,vMapping,vMapping2);
  vLeavesTemp->nSize = 0;
  lVar7 = 0x30;
  do {
    uVar5 = (uint)(wVar2 >> ((byte)lVar7 & 0x3f));
    uVar4 = uVar5 & 7;
    if (uVar4 == 6) {
      iVar6 = vLeaves->nSize;
      if (iVar6 != 5) goto LAB_006bd9b4;
    }
    else {
      Entry = uVar1;
      if (uVar4 != 7) {
        iVar6 = vLeaves->nSize;
LAB_006bd9b4:
        if (iVar6 <= (int)uVar4) {
LAB_006bda63:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Entry = vLeaves->pArray[uVar5 & 7];
      }
      Vec_IntPush(vLeavesTemp,Entry);
    }
    lVar7 = lVar7 + 4;
    if (lVar7 == 0x40) {
      local_38 = (wVar2 >> 0x20 & 0xffff) * 0x1000100010001;
      uVar5 = Gia_ManFromIfLogicCreateLut(pNew,&local_38,vLeavesTemp,vCover,vMapping,vMapping2);
      Vec_IntPush(vPacking,2);
      if (-1 < (int)uVar1) {
        Vec_IntPush(vPacking,uVar1 >> 1);
        if (-1 < (int)uVar5) {
          Vec_IntPush(vPacking,uVar5 >> 1);
          if (0 < vPacking->nSize) {
            *vPacking->pArray = *vPacking->pArray + 1;
            return uVar5;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
  } while( true );
}

Assistant:

int Gia_ManFromIfLogicCreateLutSpecial( Gia_Man_t * pNew, word * pRes, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking )
{
    word z = If_CutPerformDerive07( NULL, (unsigned *)pRes, Vec_IntSize(vLeaves), Vec_IntSize(vLeaves), NULL );
    word Truth;
    int i, iObjLit1, iObjLit2;
    // create first LUT
    Vec_IntClear( vLeavesTemp );
    for ( i = 0; i < 4; i++ )
    {
        int v = (int)((z >> (16+(i<<2))) & 7);
        if ( v == 6 && Vec_IntSize(vLeaves) == 5 )
            continue;
        Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, v) );
    }
    Truth = (z & 0xffff);
    Truth |= (Truth << 16);
    Truth |= (Truth << 32);
    iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &Truth, vLeavesTemp, vCover, vMapping, vMapping2 );
    // create second LUT
    Vec_IntClear( vLeavesTemp );
    for ( i = 0; i < 4; i++ )
    {
        int v =  (int)((z >> (48+(i<<2))) & 7);
        if ( v == 6 && Vec_IntSize(vLeaves) == 5 )
            continue;
        if ( v == 7 )
            Vec_IntPush( vLeavesTemp, iObjLit1 );
        else
            Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, v) );
    }
    Truth = ((z >> 32) & 0xffff);
    Truth |= (Truth << 16);
    Truth |= (Truth << 32);
    iObjLit2 = Gia_ManFromIfLogicCreateLut( pNew, &Truth, vLeavesTemp, vCover, vMapping, vMapping2 );
    // write packing
    Vec_IntPush( vPacking, 2 );
    Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
    Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit2) );
    Vec_IntAddToEntry( vPacking, 0, 1 );
    return iObjLit2;
}